

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<llvm::DWARFDebugLoc::Entry> * __thiscall
llvm::SmallVectorImpl<llvm::DWARFDebugLoc::Entry>::operator=
          (SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *this,
          SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *RHS)

{
  bool bVar1;
  iterator pEVar2;
  iterator pEVar3;
  iterator MinSize;
  iterator pEVar4;
  iterator pEVar5;
  Entry *local_38;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *RHS_local;
  SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *this_local;
  
  if (this != RHS) {
    bVar1 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::isSmall
                      ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)RHS);
    if (bVar1) {
      MinSize = (iterator)SmallVectorBase::size((SmallVectorBase *)RHS);
      NewEnd = (iterator)SmallVectorBase::size((SmallVectorBase *)this);
      if (NewEnd < MinSize) {
        pEVar4 = (iterator)SmallVectorBase::capacity((SmallVectorBase *)this);
        if (pEVar4 < MinSize) {
          pEVar2 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)this);
          pEVar3 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::end
                             ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)this);
          SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::destroy_range(pEVar2,pEVar3);
          SmallVectorBase::set_size((SmallVectorBase *)this,0);
          NewEnd = (iterator)0x0;
          SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::grow
                    (&this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>,
                     (size_t)MinSize);
        }
        else if (NewEnd != (iterator)0x0) {
          pEVar2 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)RHS);
          pEVar3 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)RHS);
          pEVar5 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)this);
          std::move<llvm::DWARFDebugLoc::Entry*,llvm::DWARFDebugLoc::Entry*>
                    (pEVar2,pEVar3 + (long)NewEnd,pEVar5);
        }
        pEVar2 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)RHS);
        pEVar3 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::end
                           ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)RHS);
        pEVar5 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)this);
        SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,false>::
        uninitialized_move<llvm::DWARFDebugLoc::Entry*,llvm::DWARFDebugLoc::Entry*>
                  (pEVar2 + (long)NewEnd,pEVar3,pEVar5 + (long)NewEnd);
        SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
        clear(RHS);
      }
      else {
        local_38 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)this);
        if (MinSize != (iterator)0x0) {
          pEVar2 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)RHS);
          pEVar3 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::end
                             ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)RHS);
          local_38 = std::move<llvm::DWARFDebugLoc::Entry*,llvm::DWARFDebugLoc::Entry*>
                               (pEVar2,pEVar3,local_38);
        }
        pEVar2 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::end
                           ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)this);
        SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::destroy_range(local_38,pEVar2);
        SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
        clear(RHS);
      }
    }
    else {
      pEVar2 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::begin
                         ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)this);
      pEVar3 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::end
                         ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)this);
      SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::destroy_range(pEVar2,pEVar3);
      bVar1 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::isSmall
                        ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)this);
      if (!bVar1) {
        pEVar2 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)this);
        free(pEVar2);
      }
      (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.BeginX
           = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
             super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase
             .BeginX;
      (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size =
           (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
           super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
           Size;
      (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
      Capacity = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                 super_SmallVectorBase.Capacity;
      SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>::resetToSmall
                ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void> *)RHS);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->Size = RHS.Size;
    this->Capacity = RHS.Capacity;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->set_size(RHSSize);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);

  RHS.clear();
  return *this;
}